

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
vector(vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_> *this
      ,size_t count,Bin *value,polymorphic_allocator<pbrt::AliasTable::Bin> *alloc)

{
  Bin *pBVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->nStored = 0;
  this->ptr = (Bin *)0x0;
  this->nAlloc = 0;
  reserve(this,count);
  lVar2 = 0;
  sVar3 = count;
  while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
    pBVar1 = this->ptr;
    *(int *)((long)&pBVar1->alias + lVar2) = value->alias;
    *(undefined8 *)((long)&pBVar1->q + lVar2) = *(undefined8 *)value;
    lVar2 = lVar2 + 0xc;
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }